

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void sha2_256_64(void *key,int len,uint32_t seed,void *out)

{
  hash_state *in_RCX;
  uint in_EDX;
  uchar buf [32];
  ulong64 local_38;
  unsigned_long in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  
  sha256_init((hash_state *)0x112762);
  ltc_state.sha256.state[0] = in_EDX ^ 0x6a09e667;
  sha256_process(in_RCX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sha256_done(in_RCX,in_stack_ffffffffffffffe0);
  (in_RCX->chc).length = local_38;
  return;
}

Assistant:

inline void sha2_256_64(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  unsigned char buf[32];
  sha256_init(&ltc_state);
  ltc_state.sha256.state[0] = 0x6A09E667UL ^ seed;
  sha256_process(&ltc_state, (unsigned char *)key, len);
  sha256_done(&ltc_state, buf);
  memcpy(out, buf, 8);
}